

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O1

bool upb_Message_SetExtensionInt32
               (upb_Message *msg,upb_MiniTableExtension *e,int32_t value,upb_Arena *a)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  upb_Extension *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar1 = (e->field_dont_copy_me__upb_internal_use_only).
          descriptortype_dont_copy_me__upb_internal_use_only;
  uVar5 = (ulong)bVar1;
  bVar2 = (e->field_dont_copy_me__upb_internal_use_only).mode_dont_copy_me__upb_internal_use_only;
  if ((bVar2 & 0x10) == 0) {
    uVar6 = uVar5 - 1;
  }
  else {
    uVar6 = 0xd;
    if (uVar5 != 5) {
      if (bVar1 != 0xc) goto LAB_001850e5;
      uVar6 = 8;
    }
  }
  if ((0x14010UL >> (uVar6 & 0x3f) & 1) == 0) {
    if ((bVar2 & 0x10) == 0) {
      if (bVar1 != 0xe) {
LAB_001850c6:
        __assert_fail("upb_MiniTableExtension_CType(e) == kUpb_CType_Int32 || upb_MiniTableExtension_CType(e) == kUpb_CType_Enum"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x2d2,
                      "bool upb_Message_SetExtensionInt32(struct upb_Message *, const upb_MiniTableExtension *, int32_t, upb_Arena *)"
                     );
      }
    }
    else if (uVar5 != 5) {
      if (bVar1 != 0xc) {
LAB_001850e5:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
      goto LAB_001850c6;
    }
  }
  if ((bVar2 & 0xc0) != 0x40) {
    __assert_fail("_upb_MiniTableExtension_GetRep_dont_copy_me__upb_internal_use_only(e) == kUpb_FieldRep_4Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x2d4,
                  "bool upb_Message_SetExtensionInt32(struct upb_Message *, const upb_MiniTableExtension *, int32_t, upb_Arena *)"
                 );
  }
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x145,
                  "bool upb_Message_SetExtension(struct upb_Message *, const upb_MiniTableExtension *, const void *, upb_Arena *)"
                 );
  }
  if (a == (upb_Arena *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x146,
                  "bool upb_Message_SetExtension(struct upb_Message *, const upb_MiniTableExtension *, const void *, upb_Arena *)"
                 );
  }
  puVar4 = _upb_Message_GetOrCreateExtension_dont_copy_me__upb_internal_use_only(msg,e,a);
  if (puVar4 == (upb_Extension *)0x0) {
    return false;
  }
  uVar3 = (*(code *)(&DAT_003a2dac +
                    *(int *)(&DAT_003a2dac +
                            (ulong)((e->field_dont_copy_me__upb_internal_use_only).
                                    mode_dont_copy_me__upb_internal_use_only >> 6) * 4)))();
  return (bool)uVar3;
}

Assistant:

UPB_API_INLINE bool upb_Message_SetExtensionInt32(
    struct upb_Message* msg, const upb_MiniTableExtension* e, int32_t value,
    upb_Arena* a) {
  UPB_ASSUME(upb_MiniTableExtension_CType(e) == kUpb_CType_Int32 ||
             upb_MiniTableExtension_CType(e) == kUpb_CType_Enum);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableExtension_GetRep)(e) ==
             kUpb_FieldRep_4Byte);
  return upb_Message_SetExtension(msg, e, &value, a);
}